

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O1

char * choc::text::FloatToStringBuffer<float>::writeShortInteger(char *dest,int n)

{
  char cVar1;
  byte *pbVar2;
  char cVar3;
  
  for (; pbVar2 = (byte *)dest + 1, n < 0; n = -n) {
    *dest = 0x2d;
    dest = (char *)pbVar2;
  }
  cVar3 = (char)n;
  if (99 < n) {
    cVar1 = (char)((uint)n / 10);
    *dest = (char)((ulong)(uint)n / 100) + 0x30;
    *pbVar2 = cVar1 + (char)(((ulong)(uint)n / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
    ((byte *)dest)[2] = cVar3 + (cVar1 + (char)((uint)n / 10)) * -5 | 0x30;
    return (char *)((byte *)dest + 3);
  }
  if (9 < n) {
    *dest = (char)((ulong)(uint)n / 10) + 0x30;
    *pbVar2 = cVar3 + (char)((uint)n / 10) * -10 | 0x30;
    return (char *)((byte *)dest + 2);
  }
  *dest = cVar3 + 0x30;
  return (char *)pbVar2;
}

Assistant:

[[nodiscard]] static char* writeShortInteger (char* dest, int n)
    {
        if (n < 0)    return writeShortInteger (write (dest, '-'), -n);
        if (n >= 100) return writeDigit (dest, n / 100, (n / 10) % 10, n % 10);
        if (n >= 10)  return writeDigit (dest, n / 10,  n % 10);

        return writeDigit (dest, n);
    }